

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  long lVar1;
  initializer_list<transaction_identifier<true>_> __l;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l_00;
  undefined1 uVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  back_insert_iterator<std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  bVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  long lVar9;
  back_insert_iterator<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  this_00;
  back_insert_iterator<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  ws_00;
  size_type sVar10;
  reference pWVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>,_bool> pVar13;
  undefined4 in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  string *in_stack_ffffffffffffef90;
  undefined4 in_stack_ffffffffffffef98;
  undefined2 in_stack_ffffffffffffef9c;
  undefined1 in_stack_ffffffffffffef9e;
  undefined1 in_stack_ffffffffffffef9f;
  _Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> in_stack_ffffffffffffefa0;
  ValidationState<PackageValidationResult> *in_stack_ffffffffffffefa8;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  *in_stack_ffffffffffffefb0;
  CFeeRate in_stack_ffffffffffffefb8;
  undefined7 in_stack_ffffffffffffefc0;
  undefined1 in_stack_ffffffffffffefc7;
  allocator<char> *in_stack_ffffffffffffefc8;
  CFeeRate in_stack_ffffffffffffefd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  *in_stack_ffffffffffffefe0;
  undefined6 in_stack_ffffffffffffefe8;
  undefined1 in_stack_ffffffffffffefee;
  undefined1 in_stack_ffffffffffffefef;
  iterator in_stack_ffffffffffffeff0;
  MemPoolAccept *in_stack_ffffffffffffeff8;
  CAmount in_stack_fffffffffffff028;
  ATMPArgs *args_00;
  undefined8 in_stack_fffffffffffff0d0;
  PackageValidationState *in_stack_fffffffffffff0d8;
  Package *in_stack_fffffffffffff0e0;
  bool local_f02;
  setEntries *in_stack_fffffffffffff100;
  Package *in_stack_fffffffffffff108;
  CTransactionRef *in_stack_fffffffffffff110;
  PackageValidationState *workspaces_00;
  undefined6 in_stack_fffffffffffff170;
  undefined1 in_stack_fffffffffffff177;
  byte bVar14;
  MemPoolAccept *in_stack_fffffffffffff178;
  Workspace *ws_2;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *__range1_2;
  undefined7 in_stack_fffffffffffff198;
  undefined1 in_stack_fffffffffffff19f;
  PackageValidationState *in_stack_fffffffffffff1a0;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *in_stack_fffffffffffff1a8;
  ATMPArgs *in_stack_fffffffffffff1b0;
  back_insert_iterator<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  this_02;
  int64_t in_stack_fffffffffffff1c0;
  Workspace *ws_1;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *__range1_1;
  Workspace *ws;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *__range1;
  ATMPArgs *args_local;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *txns_local;
  MemPoolAccept *this_local;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids;
  CFeeRate effective_feerate;
  undefined1 local_d42 [2];
  iterator __end1_2;
  iterator __begin1_2;
  allocator<char> local_d1a;
  allocator<char> local_d19;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  allocator<char> local_cf1;
  iterator __end1_1;
  iterator __begin1_1;
  allocator<char> local_cdc;
  allocator<char> local_cdb;
  allocator<char> local_cda;
  allocator<char> local_cd9 [15];
  allocator<char> local_cca;
  allocator<char> local_cc9;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  workspaces;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  Workspace *in_stack_fffffffffffff508;
  ATMPArgs *in_stack_fffffffffffff510;
  MemPoolAccept *in_stack_fffffffffffff518;
  undefined1 local_758 [256];
  undefined1 local_658 [184];
  TxValidationState placeholder_state;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  PackageValidationState package_state;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffff0d0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffef9f,
                              CONCAT16(in_stack_ffffffffffffef9e,
                                       CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)
                                      )),(char *)in_stack_ffffffffffffef90,in_stack_ffffffffffffef8c
             ,(AnnotatedMixin<std::recursive_mutex> *)0x7fb036);
  workspaces_00 = &package_state;
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88)
            );
  uVar2 = IsWellFormedPackage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,(bool)uVar2);
  if ((bool)uVar2) {
    workspaces.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    workspaces.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    workspaces.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::vector((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::reserve((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)in_stack_ffffffffffffefc8,
              CONCAT17(in_stack_ffffffffffffefc7,in_stack_ffffffffffffefc0));
    cVar4 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_ffffffffffffef90);
    cVar5 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_ffffffffffffef90);
    bVar6 = std::
            back_inserter<std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>
                      ((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        *)in_stack_ffffffffffffef90);
    std::
    transform<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,std::back_insert_iterator<std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,(anonymous_namespace)::MemPoolAccept::AcceptMultipleTransactions(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__0>
              (cVar4._M_current,cVar5._M_current,bVar6.container);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffefc8,
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_ffffffffffffefc7,in_stack_ffffffffffffefc0),
               (char *)in_stack_ffffffffffffefb8.nSatoshisPerK,(char *)in_stack_ffffffffffffefb0,
               (int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffefa8 >> 0x18,0));
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::begin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             *)in_stack_ffffffffffffef90);
    __end1 = std::
             vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             ::end((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    *)in_stack_ffffffffffffef90);
    while (bVar3 = __gnu_cxx::
                   operator==<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                             ((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                               *)CONCAT17(in_stack_ffffffffffffef9f,
                                          CONCAT16(in_stack_ffffffffffffef9e,
                                                   CONCAT24(in_stack_ffffffffffffef9c,
                                                            in_stack_ffffffffffffef98))),
                              (__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                               *)in_stack_ffffffffffffef90), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
      ::operator*((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                   *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      bVar3 = PreChecks(in_stack_fffffffffffff518,in_stack_fffffffffffff510,
                        in_stack_fffffffffffff508);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        ValidationState<PackageValidationResult>::Invalid
                  (in_stack_ffffffffffffefa8,
                   (PackageValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,in_stack_ffffffffffffef90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cca);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cc9);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        TxValidationState::TxValidationState
                  ((TxValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (TxValidationState *)0x7fb435);
        MempoolAcceptResult::Failure((TxValidationState *)in_stack_ffffffffffffefb8.nSatoshisPerK);
        std::
        map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)in_stack_ffffffffffffefa8,
                   (transaction_identifier<true> *)in_stack_ffffffffffffefa0._M_node,
                   (MempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                  );
        MempoolAcceptResult::~MempoolAcceptResult
                  ((MempoolAcceptResult *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        TxValidationState::~TxValidationState
                  ((TxValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (PackageValidationState *)0x7fb4c9);
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,(PackageValidationState *)in_stack_ffffffffffffef90,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        goto LAB_007fce0d;
      }
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<CFeeRate> *)
                         CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      local_f02 = false;
      if (bVar3) {
        CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffefa8,
                           (CAmount *)in_stack_ffffffffffffefa0._M_node,
                           CONCAT13(in_stack_ffffffffffffef9f,
                                    CONCAT12(in_stack_ffffffffffffef9e,in_stack_ffffffffffffef9c)));
        std::optional<CFeeRate>::value
                  ((optional<CFeeRate> *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                  );
        local_f02 = operator>((CFeeRate *)
                              CONCAT17(in_stack_ffffffffffffef9f,
                                       CONCAT16(in_stack_ffffffffffffef9e,
                                                CONCAT24(in_stack_ffffffffffffef9c,
                                                         in_stack_ffffffffffffef98))),
                              (CFeeRate *)in_stack_ffffffffffffef90);
      }
      if (local_f02 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        ValidationState<TxValidationResult>::Invalid
                  ((ValidationState<TxValidationResult> *)in_stack_ffffffffffffefa8,
                   (TxValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,in_stack_ffffffffffffef90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cda);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(local_cd9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        ValidationState<PackageValidationResult>::Invalid
                  (in_stack_ffffffffffffefa8,
                   (PackageValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,in_stack_ffffffffffffef90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cdc);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cdb);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        TxValidationState::TxValidationState
                  ((TxValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (TxValidationState *)0x7fb8c3);
        MempoolAcceptResult::Failure((TxValidationState *)in_stack_ffffffffffffefb8.nSatoshisPerK);
        std::
        map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
        ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                  ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)in_stack_ffffffffffffefa8,
                   (transaction_identifier<true> *)in_stack_ffffffffffffefa0._M_node,
                   (MempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                  );
        MempoolAcceptResult::~MempoolAcceptResult
                  ((MempoolAcceptResult *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        TxValidationState::~TxValidationState
                  ((TxValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (PackageValidationState *)0x7fb957);
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,(PackageValidationState *)in_stack_ffffffffffffef90,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        goto LAB_007fce0d;
      }
      CCoinsViewMemPool::PackageAddTransaction
                ((CCoinsViewMemPool *)
                 CONCAT17(in_stack_ffffffffffffefef,
                          CONCAT16(in_stack_ffffffffffffefee,in_stack_ffffffffffffefe8)),
                 (CTransactionRef *)in_stack_ffffffffffffefe0);
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
      ::operator++((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    }
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::begin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             *)in_stack_ffffffffffffef90);
    __end1_1 = std::
               vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               ::end((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      *)in_stack_ffffffffffffef90);
    while (bVar3 = __gnu_cxx::
                   operator==<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                             ((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                               *)CONCAT17(in_stack_ffffffffffffef9f,
                                          CONCAT16(in_stack_ffffffffffffef9e,
                                                   CONCAT24(in_stack_ffffffffffffef9c,
                                                            in_stack_ffffffffffffef98))),
                              (__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                               *)in_stack_ffffffffffffef90), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
      ::operator*((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                   *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      PackageTRUCChecks_abi_cxx11_
                (in_stack_fffffffffffff110,in_stack_fffffffffffff1c0,in_stack_fffffffffffff108,
                 in_stack_fffffffffffff100);
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                   in_stack_ffffffffffffefc8);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT17(in_stack_ffffffffffffef9f,
                          CONCAT16(in_stack_ffffffffffffef9e,
                                   CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))));
        ValidationState<PackageValidationResult>::Invalid
                  (in_stack_ffffffffffffefa8,
                   (PackageValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                   (string *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,in_stack_ffffffffffffef90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::allocator<char>::~allocator(&local_cf1);
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (PackageValidationState *)0x7fbca6);
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,(PackageValidationState *)in_stack_ffffffffffffef90,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      if (bVar3) goto LAB_007fce0d;
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
      ::operator++((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    }
    cVar7 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cbegin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      *)in_stack_ffffffffffffef90);
    cVar8 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cend((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    *)in_stack_ffffffffffffef90);
    lVar9 = std::
            accumulate<__gnu_cxx::__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_const*,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,long,(anonymous_namespace)::MemPoolAccept::AcceptMultipleTransactions(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__1>
                      (cVar7._M_current,cVar8._M_current,0);
    (this->m_subpackage).m_total_vsize = lVar9;
    cVar7 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cbegin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      *)in_stack_ffffffffffffef90);
    cVar8 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cend((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    *)in_stack_ffffffffffffef90);
    lVar9 = std::
            accumulate<__gnu_cxx::__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_const*,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,long,(anonymous_namespace)::MemPoolAccept::AcceptMultipleTransactions(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__2>
                      (cVar7._M_current,cVar8._M_current,0);
    (this->m_subpackage).m_total_modified_fees = lVar9;
    CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffefa8,
                       (CAmount *)in_stack_ffffffffffffefa0._M_node,
                       CONCAT13(in_stack_ffffffffffffef9f,
                                CONCAT12(in_stack_ffffffffffffef9e,in_stack_ffffffffffffef9c)));
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::size((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    reserve((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            in_stack_ffffffffffffefc8,CONCAT17(in_stack_ffffffffffffefc7,in_stack_ffffffffffffefc0))
    ;
    args_00 = (ATMPArgs *)&workspaces;
    cVar7 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cbegin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      *)in_stack_ffffffffffffef90);
    cVar8 = std::
            vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ::cend((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    *)in_stack_ffffffffffffef90);
    this_00 = std::
              back_inserter<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>
                        ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          *)in_stack_ffffffffffffef90);
    ws_00 = std::
            transform<__gnu_cxx::__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_const*,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,std::back_insert_iterator<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,(anonymous_namespace)::MemPoolAccept::AcceptMultipleTransactions(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,(anonymous_namespace)::MemPoolAccept::ATMPArgs&)::__3>
                      (cVar7._M_current,cVar8._M_current,this_00.container);
    this_02 = ws_00;
    TxValidationState::TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    if (((args->m_package_feerates & 1U) == 0) ||
       (bVar3 = CheckFeeRate(in_stack_ffffffffffffeff8,(size_t)in_stack_ffffffffffffeff0,
                             in_stack_fffffffffffff028,
                             (TxValidationState *)
                             CONCAT17(in_stack_ffffffffffffefef,
                                      CONCAT16(in_stack_ffffffffffffefee,in_stack_ffffffffffffefe8))
                            ), bVar3)) {
      sVar10 = std::
               vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      if ((sVar10 < 2) ||
         (bVar3 = PackageMempoolChecks
                            (in_stack_fffffffffffff178,
                             (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)CONCAT17(in_stack_fffffffffffff177,
                                         CONCAT16(uVar2,in_stack_fffffffffffff170)),
                             (vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                              *)workspaces_00,(int64_t)this,&__return_storage_ptr__->m_state), bVar3
         )) {
        std::
        vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ::begin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                 *)in_stack_ffffffffffffef90);
        __end1_2 = std::
                   vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ::end((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          *)in_stack_ffffffffffffef90);
        while (bVar3 = __gnu_cxx::
                       operator==<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                                 ((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                                   *)CONCAT17(in_stack_ffffffffffffef9f,
                                              CONCAT16(in_stack_ffffffffffffef9e,
                                                       CONCAT24(in_stack_ffffffffffffef9c,
                                                                in_stack_ffffffffffffef98))),
                                  (__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                                   *)in_stack_ffffffffffffef90), ((bVar3 ^ 0xffU) & 1) != 0) {
          pWVar11 = __gnu_cxx::
                    __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                    ::operator*((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
          (pWVar11->m_package_feerate).nSatoshisPerK = package_feerate.nSatoshisPerK;
          bVar3 = PolicyScriptChecks((MemPoolAccept *)this_00.container,args_00,
                                     (Workspace *)ws_00.container);
          if (!bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                       in_stack_ffffffffffffefc8);
            this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d42
            ;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this_01,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                       in_stack_ffffffffffffefc8);
            ValidationState<PackageValidationResult>::Invalid
                      (in_stack_ffffffffffffefa8,
                       (PackageValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                       (string *)
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))),
                       in_stack_ffffffffffffef90);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            std::allocator<char>::~allocator((allocator<char> *)local_d42);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            std::allocator<char>::~allocator((allocator<char> *)(local_d42 + 1));
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            CTransaction::GetWitnessHash
                      ((CTransaction *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88)
                      );
            TxValidationState::TxValidationState
                      ((TxValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                       (TxValidationState *)0x7fc79f);
            MempoolAcceptResult::Failure
                      ((TxValidationState *)in_stack_ffffffffffffefb8.nSatoshisPerK);
            std::
            map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)in_stack_ffffffffffffefa8,
                       (transaction_identifier<true> *)in_stack_ffffffffffffefa0._M_node,
                       (MempoolAcceptResult *)
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))));
            MempoolAcceptResult::~MempoolAcceptResult
                      ((MempoolAcceptResult *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            TxValidationState::~TxValidationState
                      ((TxValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            PackageValidationState::PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                       (PackageValidationState *)0x7fc824);
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      ((PackageMempoolAcceptResult *)
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))),
                       (PackageValidationState *)in_stack_ffffffffffffef90,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            PackageValidationState::~PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            goto LAB_007fcdd5;
          }
          if ((args->m_test_accept & 1U) != 0) {
            if ((args->m_package_feerates & 1U) == 0) {
              CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffefa8,
                                 (CAmount *)in_stack_ffffffffffffefa0._M_node,
                                 CONCAT13(in_stack_ffffffffffffef9f,
                                          CONCAT12(in_stack_ffffffffffffef9e,
                                                   in_stack_ffffffffffffef9c)));
            }
            bVar14 = 0;
            if ((args->m_package_feerates & 1U) == 0) {
              std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
              in_stack_ffffffffffffefb8.nSatoshisPerK =
                   (CAmount)CTransaction::GetWitnessHash
                                      ((CTransaction *)
                                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88)
                                      );
              std::allocator<transaction_identifier<true>_>::allocator
                        ((allocator<transaction_identifier<true>_> *)
                         CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
              bVar14 = 1;
              __l._M_len = (size_type)in_stack_ffffffffffffefd8;
              __l._M_array = (iterator)in_stack_ffffffffffffefd0.nSatoshisPerK;
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)in_stack_ffffffffffffefc8,__l,
                     (allocator_type *)CONCAT17(in_stack_ffffffffffffefc7,in_stack_ffffffffffffefc0)
                    );
            }
            else {
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)in_stack_ffffffffffffefe0,
                     (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)in_stack_ffffffffffffefd8);
            }
            if ((bVar14 & 1) != 0) {
              std::allocator<transaction_identifier<true>_>::~allocator
                        ((allocator<transaction_identifier<true>_> *)
                         CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            }
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            in_stack_ffffffffffffefa8 =
                 (ValidationState<PackageValidationResult> *)
                 CTransaction::GetWitnessHash
                           ((CTransaction *)
                            CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            MempoolAcceptResult::Success
                      ((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)in_stack_ffffffffffffefa0._M_node,
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))),
                       (CAmount)in_stack_ffffffffffffef90,in_stack_ffffffffffffefb8,
                       (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            pVar13 = std::
                     map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                     ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                               ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                                 *)in_stack_ffffffffffffefa8,
                                (transaction_identifier<true> *)in_stack_ffffffffffffefa0._M_node,
                                (MempoolAcceptResult *)
                                CONCAT17(in_stack_ffffffffffffef9f,
                                         CONCAT16(in_stack_ffffffffffffef9e,
                                                  CONCAT24(in_stack_ffffffffffffef9c,
                                                           in_stack_ffffffffffffef98))));
            in_stack_ffffffffffffefa0 = pVar13.first._M_node;
            in_stack_ffffffffffffef9f = pVar13.second;
            MempoolAcceptResult::~MempoolAcceptResult
                      ((MempoolAcceptResult *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            std::
            vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
            ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))));
          }
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
          ::operator++((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        }
        if ((args->m_test_accept & 1U) == 0) {
          in_stack_ffffffffffffef9e =
               SubmitPackage((MemPoolAccept *)this_02.container,in_stack_fffffffffffff1b0,
                             in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,
                             (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                              *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198));
          if ((bool)in_stack_ffffffffffffef9e) {
            PackageValidationState::PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                       (PackageValidationState *)0x7fcd73);
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      ((PackageMempoolAcceptResult *)
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))),
                       (PackageValidationState *)in_stack_ffffffffffffef90,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            PackageValidationState::~PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
          }
          else {
            PackageValidationState::PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                       (PackageValidationState *)0x7fccf6);
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      ((PackageMempoolAcceptResult *)
                       CONCAT17(in_stack_ffffffffffffef9f,
                                CONCAT16(in_stack_ffffffffffffef9e,
                                         CONCAT24(in_stack_ffffffffffffef9c,
                                                  in_stack_ffffffffffffef98))),
                       (PackageValidationState *)in_stack_ffffffffffffef90,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            PackageValidationState::~PackageValidationState
                      ((PackageValidationState *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
          }
        }
        else {
          PackageValidationState::PackageValidationState
                    ((PackageValidationState *)
                     CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                     (PackageValidationState *)0x7fcc3c);
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    ((PackageMempoolAcceptResult *)
                     CONCAT17(in_stack_ffffffffffffef9f,
                              CONCAT16(in_stack_ffffffffffffef9e,
                                       CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)
                                      )),(PackageValidationState *)in_stack_ffffffffffffef90,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
          PackageValidationState::~PackageValidationState
                    ((PackageValidationState *)
                     CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        }
      }
      else {
        PackageValidationState::PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                   (PackageValidationState *)0x7fc58f);
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  ((PackageMempoolAcceptResult *)
                   CONCAT17(in_stack_ffffffffffffef9f,
                            CONCAT16(in_stack_ffffffffffffef9e,
                                     CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)))
                   ,(PackageValidationState *)in_stack_ffffffffffffef90,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
        PackageValidationState::~PackageValidationState
                  ((PackageValidationState *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                 in_stack_ffffffffffffefc8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0.nSatoshisPerK,
                 in_stack_ffffffffffffefc8);
      ValidationState<PackageValidationResult>::Invalid
                (in_stack_ffffffffffffefa8,
                 (PackageValidationResult)((ulong)in_stack_ffffffffffffefa0._M_node >> 0x20),
                 (string *)
                 CONCAT17(in_stack_ffffffffffffef9f,
                          CONCAT16(in_stack_ffffffffffffef9e,
                                   CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))),
                 in_stack_ffffffffffffef90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::allocator<char>::~allocator(&local_d1a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::allocator<char>::~allocator(&local_d19);
      PackageValidationState::PackageValidationState
                ((PackageValidationState *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                 (PackageValidationState *)0x7fc0f9);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::back((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
                 (TxValidationState *)0x7fc153);
      CFeeRate::CFeeRate((CFeeRate *)in_stack_ffffffffffffefa8,
                         (CAmount *)in_stack_ffffffffffffefa0._M_node,
                         CONCAT13(in_stack_ffffffffffffef9f,
                                  CONCAT12(in_stack_ffffffffffffef9e,in_stack_ffffffffffffef9c)));
      MempoolAcceptResult::FeeFailure
                ((TxValidationState *)in_stack_ffffffffffffefb8.nSatoshisPerK,
                 in_stack_ffffffffffffefd0,in_stack_ffffffffffffefb0);
      std::pair<const_uint256,_MempoolAcceptResult>::
      pair<const_transaction_identifier<true>_&,_MempoolAcceptResult,_true>
                ((pair<const_uint256,_MempoolAcceptResult> *)
                 CONCAT17(in_stack_ffffffffffffef9f,
                          CONCAT16(in_stack_ffffffffffffef9e,
                                   CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))),
                 (transaction_identifier<true> *)in_stack_ffffffffffffef90,
                 (MempoolAcceptResult *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>::allocator
                ((allocator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      __l_00._M_len = (size_type)in_stack_ffffffffffffeff8;
      __l_00._M_array = in_stack_ffffffffffffeff0;
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::map(in_stack_ffffffffffffefe0,__l_00,(less<uint256> *)in_stack_ffffffffffffefd8,
            (allocator_type *)in_stack_ffffffffffffefd0.nSatoshisPerK);
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                ((PackageMempoolAcceptResult *)
                 CONCAT17(in_stack_ffffffffffffef9f,
                          CONCAT16(in_stack_ffffffffffffef9e,
                                   CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))),
                 (PackageValidationState *)in_stack_ffffffffffffef90,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>::~allocator
                ((allocator<std::pair<const_uint256,_MempoolAcceptResult>_> *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      puVar12 = local_658;
      do {
        puVar12 = puVar12 + -0x100;
        std::pair<const_uint256,_MempoolAcceptResult>::~pair
                  ((pair<const_uint256,_MempoolAcceptResult> *)
                   CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      } while (puVar12 != local_758);
      MempoolAcceptResult::~MempoolAcceptResult
                ((MempoolAcceptResult *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88))
      ;
      PackageValidationState::~PackageValidationState
                ((PackageValidationState *)
                 CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    }
LAB_007fcdd5:
    TxValidationState::~TxValidationState
              ((TxValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            CONCAT17(in_stack_ffffffffffffef9f,
                     CONCAT16(in_stack_ffffffffffffef9e,
                              CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))));
LAB_007fce0d:
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::~vector((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)CONCAT17(in_stack_ffffffffffffef9f,
                          CONCAT16(in_stack_ffffffffffffef9e,
                                   CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))));
  }
  else {
    PackageValidationState::PackageValidationState
              ((PackageValidationState *)
               CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88),
               (PackageValidationState *)0x7fb094);
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              ((PackageMempoolAcceptResult *)
               CONCAT17(in_stack_ffffffffffffef9f,
                        CONCAT16(in_stack_ffffffffffffef9e,
                                 CONCAT24(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98))),
               (PackageValidationState *)in_stack_ffffffffffffef90,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
            *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    PackageValidationState::~PackageValidationState
              ((PackageValidationState *)
               CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
  }
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88)
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}